

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytes.cc
# Opt level: O0

size_t xemmai::t_type_of<xemmai::t_bytes>::f_do_get_at(t_object *a_this,t_pvalue *a_stack)

{
  t_object *a_object;
  t_bytes *this;
  t_type a_index;
  intptr_t a_value;
  t_value<xemmai::t_pointer> local_28;
  t_pvalue *local_18;
  t_pvalue *a_stack_local;
  t_object *a_this_local;
  
  local_18 = a_stack;
  a_stack_local = (t_pvalue *)a_this;
  a_object = t_pointer::operator_cast_to_t_object_(&a_stack[2].super_t_pointer);
  f_check<long>(a_object,L"index");
  this = t_object::f_as<xemmai::t_bytes>((t_object *)a_stack_local);
  a_index = f_as<long,xemmai::t_value<xemmai::t_pointer>&>(local_18 + 2);
  a_value = t_bytes::f_get_at(this,a_index);
  t_value<xemmai::t_pointer>::t_value<long,_true>(&local_28,a_value);
  t_value<xemmai::t_pointer>::operator=(local_18,&local_28);
  return 0xffffffffffffffff;
}

Assistant:

size_t t_type_of<t_bytes>::f_do_get_at(t_object* a_this, t_pvalue* a_stack)
{
	f_check<intptr_t>(a_stack[2], L"index");
	a_stack[0] = a_this->f_as<t_bytes>().f_get_at(f_as<intptr_t>(a_stack[2]));
	return -1;
}